

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KCPServer.cpp
# Opt level: O2

void __thiscall net_uv::KCPServer::KCPServer(KCPServer *this)

{
  _Rb_tree_header *p_Var1;
  
  Server::Server(&this->super_Server);
  (this->super_Server).super_Runnable._vptr_Runnable = (_func_int **)&PTR__KCPServer_00179ff8;
  (this->super_Server).super_SessionManager._vptr_SessionManager =
       (_func_int **)&PTR__KCPServer_0017a098;
  this->m_start = false;
  this->m_server = (KCPSocket *)0x0;
  p_Var1 = &(this->m_allSession)._M_t._M_impl.super__Rb_tree_header;
  (this->m_allSession)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_allSession)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_allSession)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_allSession)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_allSession)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

KCPServer::KCPServer()
	: m_start(false)
	, m_server(NULL)
{
}